

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_color_quantize.cpp
# Opt level: O2

bool try_quantize_rgb_delta_blue_contract
               (vfloat4 color0,vfloat4 color1,vint4 *color0_out,vint4 *color1_out,
               quant_method quant_level)

{
  undefined4 in_register_00000014;
  vint4 *pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  vint4 value;
  vint4 vVar19;
  
  vVar19.m[1]._4_4_ = in_register_00000014;
  vVar19.m[1]._0_4_ = quant_level;
  auVar7._8_56_ = color0._16_56_;
  auVar7._0_8_ = color0.m._8_8_;
  auVar4._8_56_ = color0._8_56_;
  auVar4._0_8_ = color0.m._0_8_;
  auVar2 = auVar7._0_16_;
  auVar6 = vshufps_avx(auVar2,auVar2,0xea);
  auVar6 = vsubps_avx(auVar2,auVar6);
  auVar13._0_4_ = auVar6._0_4_ + color0.m[2];
  auVar13._4_4_ = auVar6._4_4_ + color0.m[3];
  auVar13._8_4_ = auVar6._8_4_ + color0._16_4_;
  auVar13._12_4_ = auVar6._12_4_ + color0._20_4_;
  auVar2 = auVar4._0_16_;
  auVar6 = vshufps_avx(auVar2,auVar2,0xea);
  auVar6 = vsubps_avx(auVar2,auVar6);
  auVar17._0_4_ = auVar6._0_4_ + color0.m[0];
  auVar17._4_4_ = auVar6._4_4_ + color0.m[1];
  auVar17._8_4_ = auVar6._8_4_ + color0.m[2];
  auVar17._12_4_ = auVar6._12_4_ + color0.m[3];
  auVar6 = vcmpps_avx(auVar13,ZEXT816(0) << 0x40,1);
  auVar14._8_4_ = 0x437f0000;
  auVar14._0_8_ = 0x437f0000437f0000;
  auVar14._12_4_ = 0x437f0000;
  auVar2 = vcmpps_avx(auVar14,auVar13,1);
  auVar3 = vcmpps_avx(auVar17,ZEXT816(0) << 0x40,1);
  auVar3 = vorps_avx(auVar3,auVar6);
  auVar6 = vcmpps_avx(auVar14,auVar17,1);
  auVar6 = vorps_avx(auVar6,auVar2);
  auVar6 = vorps_avx(auVar6,auVar3);
  if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar6 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar6[0xf]) {
    auVar6._0_4_ = (int)(auVar13._0_4_ + 0.5);
    auVar6._4_4_ = (int)(auVar13._4_4_ + 0.5);
    auVar6._8_4_ = (int)(auVar13._8_4_ + 0.5);
    auVar6._12_4_ = (int)(auVar13._12_4_ + 0.5);
    auVar6 = vpaddd_avx(auVar6,auVar6);
    auVar2._8_8_ = 0xfe000000fe;
    auVar2._0_8_ = 0xfe000000fe;
    auVar2 = vpand_avx(auVar6,auVar2);
    vVar19.m[0] = (longlong)color1_out;
    pvVar1 = color1_out;
    vVar19 = quant_color3(quant_level,vVar19);
    value.m[1] = vVar19.m[1];
    auVar3._8_8_ = 0x10000000100;
    auVar3._0_8_ = 0x10000000100;
    auVar6 = vpand_avx(auVar3,auVar6);
    auVar13 = vpor_avx(auVar6,auVar2);
    auVar5._0_4_ = (int)(auVar17._0_4_ + 0.5);
    auVar5._4_4_ = (int)(auVar17._4_4_ + 0.5);
    auVar5._8_4_ = (int)(auVar17._8_4_ + 0.5);
    auVar5._12_4_ = (int)(auVar17._12_4_ + 0.5);
    auVar6 = vpaddd_avx(auVar5,auVar5);
    auVar6 = vpsubd_avx(auVar6,auVar13);
    auVar14 = vpblendd_avx2(auVar6,_DAT_00264480,8);
    auVar18._8_4_ = 0xffffffc0;
    auVar18._0_8_ = 0xffffffc0ffffffc0;
    auVar18._12_4_ = 0xffffffc0;
    auVar8._8_4_ = 0xffffff7f;
    auVar8._0_8_ = 0xffffff7fffffff7f;
    auVar8._12_4_ = 0xffffff7f;
    auVar6 = vpaddd_avx(auVar14,auVar18);
    auVar3 = vpminud_avx(auVar6,auVar8);
    auVar6 = vpcmpeqd_avx(auVar6,auVar3);
    if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar6 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar6[0xf]) {
      auVar9._8_8_ = 0x7f0000007f;
      auVar9._0_8_ = 0x7f0000007f;
      auVar6 = vpand_avx(auVar14,auVar9);
      auVar3 = vpsrld_avx(auVar13,1);
      auVar10._8_8_ = 0x8000000080;
      auVar10._0_8_ = 0x8000000080;
      auVar3 = vpand_avx(auVar3,auVar10);
      auVar6 = vpor_avx(auVar6,auVar3);
      value.m[0] = (longlong)pvVar1;
      auVar3 = auVar6;
      quant_color3(quant_level,value);
      auVar11._8_4_ = 0xc0;
      auVar11._0_8_ = 0xc0000000c0;
      auVar11._12_4_ = 0xc0;
      auVar6 = vpand_avx(auVar3 ^ auVar6,auVar11);
      auVar6 = vpblendd_avx2(auVar6,(undefined1  [16])0x0,8);
      if (auVar6 == (undefined1  [16])0x0) {
        auVar6 = vpsrld_avx(auVar3,1);
        auVar12._8_4_ = 0x3f;
        auVar12._0_8_ = 0x3f0000003f;
        auVar12._12_4_ = 0x3f;
        auVar6 = vpand_avx(auVar6,auVar12);
        auVar13 = vpslld_avx(auVar3,0x19);
        auVar13 = vpsrad_avx(auVar13,0x1f);
        auVar13 = vpand_avx(auVar13,auVar18);
        auVar13 = vpor_avx(auVar6,auVar13);
        auVar6 = vphaddd_avx(auVar13,auVar13);
        auVar14 = vpshufd_avx(auVar13,0xee);
        auVar6 = vpaddd_avx(auVar6,auVar14);
        if (auVar6._0_4_ < 0) {
          auVar14 = vpsrld_avx(auVar2,1);
          auVar15._8_4_ = 0x80;
          auVar15._0_8_ = 0x8000000080;
          auVar15._12_4_ = 0x80;
          auVar6 = vpand_avx(auVar3,auVar15);
          auVar6 = vpor_avx(auVar6,auVar14);
          auVar16._8_4_ = 0x100;
          auVar16._0_8_ = 0x10000000100;
          auVar16._12_4_ = 0x100;
          auVar6 = vpaddd_avx(auVar13,auVar6);
          auVar13 = vpmaxud_avx(auVar6,auVar16);
          auVar6 = vpcmpeqd_avx(auVar6,auVar13);
          if ((((auVar6 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar6 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar6 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar6[0xf]
             ) {
            *(undefined1 (*) [16])color0_out->m = auVar2;
            *(undefined1 (*) [16])color1_out->m = auVar3;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool try_quantize_rgb_delta_blue_contract(
	vfloat4 color0,
	vfloat4 color1,
	vint4& color0_out,
	vint4& color1_out,
	quant_method quant_level
) {
	// Note: Switch around endpoint colors already at start
	std::swap(color0, color1);

	// Apply inverse blue-contraction
	color0 += color0 - color0.swz<2, 2, 2, 3>();
	color1 += color1 - color1.swz<2, 2, 2, 3>();

	// If anything overflows BC cannot be used
	vmask4 color0_error = (color0 < vfloat4(0.0f)) | (color0 > vfloat4(255.0f));
	vmask4 color1_error = (color1 < vfloat4(0.0f)) | (color1 > vfloat4(255.0f));
	if (any(color0_error | color1_error))
	{
		return false;
	}

	// Transform color0 to unorm9
	vint4 color0a = float_to_int_rtn(color0);
	color0.set_lane<3>(0.0f);
	color0a = lsl<1>(color0a);

	// Mask off the top bit
	vint4 color0b = color0a & 0xFF;

	// Quantize then unquantize in order to get a value that we take differences against
	vint4 color0be = quant_color3(quant_level, color0b);
	color0b = color0be | (color0a & 0x100);

	// Get hold of the second value
	vint4 color1d = float_to_int_rtn(color1);
	color1d = lsl<1>(color1d);

	// ... and take differences
	color1d = color1d - color0b;
	color1d.set_lane<3>(0);

	// Check if the difference is too large to be encodable
	if (any((color1d > vint4(63)) | (color1d < vint4(-64))))
	{
		return false;
	}

	// Insert top bit of the base into the offset
	color1d = color1d & 0x7F;
	color1d = color1d | lsr<1>(color0b & 0x100);

	// Then quantize and unquantize; if this causes either top two bits to flip, then encoding fails
	// since we have then corrupted either the top bit of the base or the sign bit of the offset
	vint4 color1de = quant_color3(quant_level, color1d);

	vint4 color_flips = (color1d ^ color1de) & 0xC0;
	color_flips.set_lane<3>(0);
	if (any(color_flips != vint4::zero()))
	{
		return false;
	}

	// If the sum of offsets does not trigger blue-contraction then encoding fails
	vint4 ep0 = color0be;
	vint4 ep1 = color1de;
	bit_transfer_signed(ep1, ep0);
	if (hadd_rgb_s(ep1) >= 0)
	{
		return false;
	}

	// Check that the offsets produce legitimate sums as well
	ep0 = ep0 + ep1;
	if (any((ep0 < vint4(0)) | (ep0 > vint4(0xFF))))
	{
		return false;
	}

	color0_out = color0be;
	color1_out = color1de;
	return true;
}